

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fused_activation.h
# Opt level: O0

Layer * create_activation_layer(int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  ParamDict *this;
  undefined8 in_RDX;
  Mat *in_RSI;
  int in_EDI;
  ParamDict pd_5;
  ParamDict pd_4;
  ParamDict pd_3;
  ParamDict pd_2;
  ParamDict pd_1;
  ParamDict pd;
  Layer *activation;
  ParamDict *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int index;
  ParamDict *in_stack_ffffffffffffff50;
  ParamDict local_90;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  ParamDict local_60;
  ParamDict local_50 [2];
  undefined1 local_30 [16];
  Layer *local_20;
  undefined8 local_18;
  Mat *local_10;
  
  local_20 = (Layer *)0x0;
  index = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = in_RDX;
  if (in_EDI == 1) {
    local_20 = ncnn::create_layer(index);
    ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff50);
    (*local_20->_vptr_Layer[2])(local_20,local_30);
    ncnn::ParamDict::~ParamDict(in_stack_ffffffffffffff30);
  }
  else {
    local_10 = in_RSI;
    if (in_EDI == 2) {
      local_20 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff50);
      pfVar1 = ncnn::Mat::operator[](local_10,0);
      ncnn::ParamDict::set(local_50,0,*pfVar1);
      (*local_20->_vptr_Layer[2])(local_20,local_50);
      ncnn::ParamDict::~ParamDict(in_stack_ffffffffffffff30);
    }
    else if (in_EDI == 3) {
      local_20 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff50);
      pfVar1 = ncnn::Mat::operator[](local_10,0);
      ncnn::ParamDict::set(&local_60,0,*pfVar1);
      pfVar1 = ncnn::Mat::operator[](local_10,1);
      ncnn::ParamDict::set(&local_60,1,*pfVar1);
      (*local_20->_vptr_Layer[2])(local_20,&local_60);
      ncnn::ParamDict::~ParamDict(in_stack_ffffffffffffff30);
    }
    else if (in_EDI == 4) {
      local_20 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff50);
      (*local_20->_vptr_Layer[2])(local_20,local_70);
      ncnn::ParamDict::~ParamDict(in_stack_ffffffffffffff30);
    }
    else if (in_EDI == 5) {
      local_20 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff50);
      (*local_20->_vptr_Layer[2])(local_20,local_80);
      ncnn::ParamDict::~ParamDict(in_stack_ffffffffffffff30);
    }
    else if (in_EDI == 6) {
      local_20 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff50);
      pfVar1 = ncnn::Mat::operator[](local_10,0);
      ncnn::ParamDict::set(&local_90,0,*pfVar1);
      this = (ParamDict *)ncnn::Mat::operator[](local_10,1);
      ncnn::ParamDict::set(&local_90,1,*(float *)&this->_vptr_ParamDict);
      (*local_20->_vptr_Layer[2])(local_20,&local_90);
      ncnn::ParamDict::~ParamDict(this);
    }
  }
  if (local_20 != (Layer *)0x0) {
    (*local_20->_vptr_Layer[4])(local_20,local_18);
  }
  return local_20;
}

Assistant:

static ncnn::Layer* create_activation_layer(int activation_type, const ncnn::Mat& activation_params, const ncnn::Option& opt)
{
    ncnn::Layer* activation = 0;

    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]); // slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]); // min
        pd.set(1, activation_params[1]); // max

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 5)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Mish);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 6)
    {
        activation = ncnn::create_layer(ncnn::LayerType::HardSwish);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]); // alpha
        pd.set(1, activation_params[1]); // beta

        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    return activation;
}